

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O2

bool __thiscall
cmParseMumpsCoverage::FindMumpsFile(cmParseMumpsCoverage *this,string *routine,string *filepath)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  long lVar4;
  string routine2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->RoutineToDirectory)._M_t,routine);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->RoutineToDirectory)._M_t._M_impl.super__Rb_tree_header) {
    for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 8) {
      std::operator+(&local_50,routine,*(char **)((long)&PTR_anon_var_dwarf_94bac_0072a2e0 + lVar4))
      ;
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(this->RoutineToDirectory)._M_t,&local_50);
      if (iVar3._M_node != iVar2._M_node) {
        std::__cxx11::string::_M_assign((string *)filepath);
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_00301b3e;
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
    bVar1 = false;
  }
  else {
    std::__cxx11::string::_M_assign((string *)filepath);
LAB_00301b3e:
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmParseMumpsCoverage::FindMumpsFile(std::string const& routine,
                                         std::string& filepath)
{
  std::map<std::string, std::string>::iterator i =
    this->RoutineToDirectory.find(routine);
  if (i != this->RoutineToDirectory.end()) {
    filepath = i->second;
    return true;
  }
  // try some alternate names
  const char* tryname[] = { "GUX", "GTM", "ONT", CM_NULLPTR };
  for (int k = 0; tryname[k] != CM_NULLPTR; k++) {
    std::string routine2 = routine + tryname[k];
    i = this->RoutineToDirectory.find(routine2);
    if (i != this->RoutineToDirectory.end()) {
      filepath = i->second;
      return true;
    }
  }
  return false;
}